

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void renameWalkTrigger(Walker *pWalker,Trigger *pTrigger)

{
  TriggerStep *pTVar1;
  Upsert *pUVar2;
  SrcList *pSVar3;
  TriggerStep **ppTVar4;
  byte *pbVar5;
  long lVar6;
  Upsert *pUpsert;
  
  sqlite3WalkExpr(pWalker,pTrigger->pWhen);
  ppTVar4 = &pTrigger->step_list;
  while (pTVar1 = *ppTVar4, pTVar1 != (TriggerStep *)0x0) {
    sqlite3WalkSelect(pWalker,pTVar1->pSelect);
    sqlite3WalkExpr(pWalker,pTVar1->pWhere);
    sqlite3WalkExprList(pWalker,pTVar1->pExprList);
    pUVar2 = pTVar1->pUpsert;
    if (pUVar2 != (Upsert *)0x0) {
      sqlite3WalkExprList(pWalker,pUVar2->pUpsertTarget);
      sqlite3WalkExprList(pWalker,pUVar2->pUpsertSet);
      sqlite3WalkExpr(pWalker,pUVar2->pUpsertWhere);
      sqlite3WalkExpr(pWalker,pUVar2->pUpsertTargetWhere);
    }
    pSVar3 = pTVar1->pFrom;
    if (pSVar3 != (SrcList *)0x0) {
      pbVar5 = &pSVar3->a[0].fg.field_0x1;
      for (lVar6 = 0; lVar6 < pSVar3->nSrc; lVar6 = lVar6 + 1) {
        if ((*pbVar5 & 4) != 0) {
          sqlite3WalkSelect(pWalker,(Select *)**(undefined8 **)(pbVar5 + 0x27));
        }
        pbVar5 = pbVar5 + 0x48;
      }
    }
    ppTVar4 = &pTVar1->pNext;
  }
  return;
}

Assistant:

static void renameWalkTrigger(Walker *pWalker, Trigger *pTrigger){
  TriggerStep *pStep;

  /* Find tokens to edit in WHEN clause */
  sqlite3WalkExpr(pWalker, pTrigger->pWhen);

  /* Find tokens to edit in trigger steps */
  for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
    sqlite3WalkSelect(pWalker, pStep->pSelect);
    sqlite3WalkExpr(pWalker, pStep->pWhere);
    sqlite3WalkExprList(pWalker, pStep->pExprList);
    if( pStep->pUpsert ){
      Upsert *pUpsert = pStep->pUpsert;
      sqlite3WalkExprList(pWalker, pUpsert->pUpsertTarget);
      sqlite3WalkExprList(pWalker, pUpsert->pUpsertSet);
      sqlite3WalkExpr(pWalker, pUpsert->pUpsertWhere);
      sqlite3WalkExpr(pWalker, pUpsert->pUpsertTargetWhere);
    }
    if( pStep->pFrom ){
      int i;
      SrcList *pFrom = pStep->pFrom;
      for(i=0; i<pFrom->nSrc; i++){
        if( pFrom->a[i].fg.isSubquery ){
          assert( pFrom->a[i].u4.pSubq!=0 );
          sqlite3WalkSelect(pWalker, pFrom->a[i].u4.pSubq->pSelect);
        }
      }
    }
  }
}